

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O0

void __thiscall
OctreeBuilder::create_descriptors(OctreeBuilder *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  element_type *range;
  element_type *this_00;
  element_type *this_01;
  pointer in_RSI;
  long in_RDI;
  VkDescriptorSetLayoutBinding indirect_binding;
  VkDescriptorSetLayoutBinding build_info_binding;
  VkDescriptorSetLayoutBinding fragment_list_binding;
  VkDescriptorSetLayoutBinding octree_binding;
  VkDescriptorSetLayoutBinding atomic_counter_binding;
  shared_ptr<myvk::Buffer> *in_stack_fffffffffffffd38;
  shared_ptr<myvk::BufferBase> *in_stack_fffffffffffffd40;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *in_stack_fffffffffffffd50;
  allocator_type *in_stack_fffffffffffffd68;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *in_stack_fffffffffffffd70;
  iterator in_stack_fffffffffffffd78;
  size_type in_stack_fffffffffffffd80;
  undefined1 *offset;
  vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *bindings;
  DescriptorSet *this_02;
  Ptr<DescriptorSetLayout> *in_stack_fffffffffffffdf0;
  Ptr<DescriptorPool> *in_stack_fffffffffffffdf8;
  undefined1 local_1e0 [39];
  undefined1 local_1b9 [65];
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  allocator<VkDescriptorPoolSize> local_51;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 *local_48;
  undefined8 local_40;
  vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> local_20;
  
  local_50 = 7;
  local_4c = 5;
  local_48 = &local_50;
  local_40 = 1;
  local_20.
  super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = in_RSI;
  std::allocator<VkDescriptorPoolSize>::allocator((allocator<VkDescriptorPoolSize> *)0x155aee);
  __l._M_len = in_stack_fffffffffffffd80;
  __l._M_array = (iterator)in_stack_fffffffffffffd78;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            (in_stack_fffffffffffffd70,__l,(allocator_type *)in_stack_fffffffffffffd68);
  myvk::DescriptorPool::Create
            ((Ptr<Device> *)in_stack_fffffffffffffd78,
             (uint32_t)((ulong)in_stack_fffffffffffffd70 >> 0x20),
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             in_stack_fffffffffffffd68);
  bindings = &local_20;
  std::shared_ptr<myvk::DescriptorPool>::operator=
            ((shared_ptr<myvk::DescriptorPool> *)in_stack_fffffffffffffd40,
             (shared_ptr<myvk::DescriptorPool> *)in_stack_fffffffffffffd38);
  std::shared_ptr<myvk::DescriptorPool>::~shared_ptr((shared_ptr<myvk::DescriptorPool> *)0x155b64);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~vector
            (in_stack_fffffffffffffd50);
  std::allocator<VkDescriptorPoolSize>::~allocator(&local_51);
  local_78 = 0;
  local_88 = 0x700000000;
  uStack_80 = 0x2000000001;
  local_98 = 0;
  local_a8 = 0x700000001;
  uStack_a0 = 0x2000000001;
  local_b8 = 0;
  local_c8 = 0x700000002;
  uStack_c0 = 0x2000000001;
  local_d8 = 0;
  local_e8 = 0x700000003;
  uStack_e0 = 0x2000000001;
  local_f8 = 0;
  local_108 = 0x700000004;
  uStack_100 = 0x2000000001;
  local_1b9._17_8_ = 0;
  local_1b9._1_8_ = 0x700000000;
  local_1b9._9_8_ = 0x2000000001;
  local_1b9._41_8_ = 0;
  local_1b9._25_8_ = 0x700000001;
  local_1b9._33_8_ = 0x2000000001;
  local_178 = 0;
  local_1b9._49_8_ = 0x700000002;
  local_1b9._57_8_ = 0x2000000001;
  local_160 = 0;
  local_170 = 0x700000003;
  uStack_168 = 0x2000000001;
  local_148 = 0;
  local_158 = 0x700000004;
  uStack_150 = 0x2000000001;
  local_140 = local_1b9 + 1;
  local_138 = 5;
  this_02 = (DescriptorSet *)local_1b9;
  std::allocator<VkDescriptorSetLayoutBinding>::allocator
            ((allocator<VkDescriptorSetLayoutBinding> *)0x155da2);
  __l_00._M_len = in_stack_fffffffffffffd80;
  __l_00._M_array = in_stack_fffffffffffffd78;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             in_stack_fffffffffffffd70,__l_00,in_stack_fffffffffffffd68);
  myvk::DescriptorSetLayout::Create
            ((Ptr<Device> *)
             local_20.
             super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,bindings);
  std::shared_ptr<myvk::DescriptorSetLayout>::operator=
            ((shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffd40,
             (shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffd38);
  std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)0x155e18);
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::~vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<VkDescriptorSetLayoutBinding>::~allocator
            ((allocator<VkDescriptorSetLayoutBinding> *)local_1b9);
  myvk::DescriptorSet::Create(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::shared_ptr<myvk::DescriptorSet>::operator=
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd40,
             (shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd38);
  std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x155e80);
  range = std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x155e8a);
  Counter::GetBuffer((Counter *)(in_RDI + 0x60));
  offset = local_1e0;
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  myvk::DescriptorSet::UpdateStorageBuffer
            (this_02,(Ptr<BufferBase> *)
                     local_20.
                     super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (uint32_t)((ulong)bindings >> 0x20),(uint32_t)bindings,(VkDeviceSize)offset,
             (VkDeviceSize)range);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x155ee1);
  std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x155ef5);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  myvk::DescriptorSet::UpdateStorageBuffer
            (this_02,(Ptr<BufferBase> *)
                     local_20.
                     super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (uint32_t)((ulong)bindings >> 0x20),(uint32_t)bindings,(VkDeviceSize)offset,
             (VkDeviceSize)range);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x155f4a);
  std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x155f5e);
  this_00 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x155f70);
  Voxelizer::GetVoxelFragmentList(this_00);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  myvk::DescriptorSet::UpdateStorageBuffer
            (this_02,(Ptr<BufferBase> *)
                     local_20.
                     super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (uint32_t)((ulong)bindings >> 0x20),(uint32_t)bindings,(VkDeviceSize)offset,
             (VkDeviceSize)range);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x155fbc);
  std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x155fd0);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  myvk::DescriptorSet::UpdateStorageBuffer
            (this_02,(Ptr<BufferBase> *)
                     local_20.
                     super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (uint32_t)((ulong)bindings >> 0x20),(uint32_t)bindings,(VkDeviceSize)offset,
             (VkDeviceSize)range);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x156025);
  this_01 = std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x156039);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)this_01,in_stack_fffffffffffffd38);
  myvk::DescriptorSet::UpdateStorageBuffer
            (this_02,(Ptr<BufferBase> *)
                     local_20.
                     super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (uint32_t)((ulong)bindings >> 0x20),(uint32_t)bindings,(VkDeviceSize)offset,
             (VkDeviceSize)range);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x15608e);
  return;
}

Assistant:

void OctreeBuilder::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(device, 1, {{VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 5}});
	{
		VkDescriptorSetLayoutBinding atomic_counter_binding = {};
		atomic_counter_binding.binding = 0;
		atomic_counter_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		atomic_counter_binding.descriptorCount = 1;
		atomic_counter_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		VkDescriptorSetLayoutBinding octree_binding = {};
		octree_binding.binding = 1;
		octree_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		octree_binding.descriptorCount = 1;
		octree_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		VkDescriptorSetLayoutBinding fragment_list_binding = {};
		fragment_list_binding.binding = 2;
		fragment_list_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		fragment_list_binding.descriptorCount = 1;
		fragment_list_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		VkDescriptorSetLayoutBinding build_info_binding = {};
		build_info_binding.binding = 3;
		build_info_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		build_info_binding.descriptorCount = 1;
		build_info_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		VkDescriptorSetLayoutBinding indirect_binding = {};
		indirect_binding.binding = 4;
		indirect_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		indirect_binding.descriptorCount = 1;
		indirect_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		m_descriptor_set_layout =
		    myvk::DescriptorSetLayout::Create(device, {atomic_counter_binding, octree_binding, fragment_list_binding,
		                                               build_info_binding, indirect_binding});
	}
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);
	m_descriptor_set->UpdateStorageBuffer(m_atomic_counter.GetBuffer(), 0);
	m_descriptor_set->UpdateStorageBuffer(m_octree_buffer, 1);
	m_descriptor_set->UpdateStorageBuffer(m_voxelizer_ptr->GetVoxelFragmentList(), 2);
	m_descriptor_set->UpdateStorageBuffer(m_build_info_buffer, 3);
	m_descriptor_set->UpdateStorageBuffer(m_indirect_buffer, 4);
}